

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void last_valueFinalizeFunc(sqlite3_context *pCtx)

{
  sqlite3_context *pCtx_00;
  LastValueCtx *p;
  sqlite3_value *in_stack_ffffffffffffffe8;
  
  pCtx_00 = (sqlite3_context *)
            sqlite3_aggregate_context((sqlite3_context *)in_stack_ffffffffffffffe8,0);
  if ((pCtx_00 != (sqlite3_context *)0x0) && (pCtx_00->pOut != (Mem *)0x0)) {
    sqlite3_result_value(pCtx_00,in_stack_ffffffffffffffe8);
    sqlite3_value_free((sqlite3_value *)0x22ad42);
    pCtx_00->pOut = (Mem *)0x0;
  }
  return;
}

Assistant:

static void last_valueFinalizeFunc(sqlite3_context *pCtx){
  struct LastValueCtx *p;
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->pVal ){
    sqlite3_result_value(pCtx, p->pVal);
    sqlite3_value_free(p->pVal);
    p->pVal = 0;
  }
}